

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::FundRawTransaction(JsonMappingApi *this,string *request_message)

{
  function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
  local_58;
  function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<void(cfd::js::api::json::FundRawTransactionRequest*,cfd::js::api::json::FundRawTransactionResponse*)>
  ::
  function<void(&)(cfd::js::api::json::FundRawTransactionRequest*,cfd::js::api::json::FundRawTransactionResponse*),void>
            ((function<void(cfd::js::api::json::FundRawTransactionRequest*,cfd::js::api::json::FundRawTransactionResponse*)>
              *)&local_38,TransactionJsonApi::FundRawTransaction);
  std::
  function<void(cfd::js::api::json::FundRawTransactionRequest*,cfd::js::api::json::FundRawTransactionResponse*)>
  ::
  function<void(&)(cfd::js::api::json::FundRawTransactionRequest*,cfd::js::api::json::FundRawTransactionResponse*),void>
            ((function<void(cfd::js::api::json::FundRawTransactionRequest*,cfd::js::api::json::FundRawTransactionResponse*)>
              *)&local_58,ElementsTransactionJsonApi::FundRawTransaction);
  ExecuteElementsCheckDirectApi<cfd::js::api::json::FundRawTransactionRequest,cfd::js::api::json::FundRawTransactionResponse>
            ((json *)this,request_message,&local_38,&local_58);
  std::
  function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
  ::~function(&local_58);
  std::
  function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::FundRawTransaction(
    const std::string &request_message) {
  return ExecuteElementsCheckDirectApi<
      api::json::FundRawTransactionRequest,
      api::json::FundRawTransactionResponse>(
      request_message, TransactionJsonApi::FundRawTransaction,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionJsonApi::FundRawTransaction);
#else
      TransactionJsonApi::FundRawTransaction);
#endif
}